

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin-ratelimit.hh
# Opt level: O1

void __thiscall
discordpp::
PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>
::CountedSet<unsigned_long>::erase(CountedSet<unsigned_long> *this,unsigned_long t,size_t count)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  out_of_range *this_00;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar4;
  unsigned_long local_18;
  
  if (count == 0) {
    return;
  }
  p_Var1 = &(this->map)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < t]) {
    if (*(ulong *)(p_Var3 + 1) >= t) {
      p_Var2 = p_Var3;
    }
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) && (p_Var3 = p_Var2, t < *(ulong *)(p_Var2 + 1))) {
    p_Var3 = &p_Var1->_M_header;
  }
  local_18 = t;
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Erased a key that doesn\'t exist");
  }
  else {
    p_Var2 = p_Var3[1]._M_parent;
    if (count <= p_Var2) {
      this->sum = this->sum - count;
      p_Var2 = (_Base_ptr)((long)p_Var2 - count);
      p_Var3[1]._M_parent = p_Var2;
      if (p_Var2 != (_Base_ptr)0x0) {
        return;
      }
      pVar4 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              ::equal_range(&(this->map)._M_t,&local_18);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ::_M_erase_aux(&(this->map)._M_t,(_Base_ptr)pVar4.first._M_node,
                     (_Base_ptr)pVar4.second._M_node);
      return;
    }
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Erased a key by more than its value");
  }
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void erase(T t, size_t count = 1) {
            if (!count)
                return;

            auto entry = map.find(t);
            if (entry == map.end())
                throw std::out_of_range("Erased a key that doesn't exist");
            if (count > entry->second)
                throw std::out_of_range("Erased a key by more than its value");
            sum -= count;
            entry->second -= count;
            if (entry->second == 0) {
                map.erase(t);
            }
        }